

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aspa_array.c
# Opt level: O1

void aspa_array_free(aspa_array *array,_Bool free_provider_arrays)

{
  long lVar1;
  void *ptr;
  long lVar2;
  ulong uVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (array == (aspa_array *)0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return;
    }
  }
  else {
    if (array->data != (aspa_record *)0x0) {
      if ((free_provider_arrays) && (array->size != 0)) {
        lVar2 = 0x10;
        uVar3 = 0;
        do {
          ptr = *(void **)((long)&array->data->customer_asn + lVar2);
          if (ptr != (void *)0x0) {
            lrtr_free(ptr);
            *(undefined8 *)((long)&array->data->customer_asn + lVar2) = 0;
          }
          uVar3 = uVar3 + 1;
          lVar2 = lVar2 + 0x18;
        } while (uVar3 < array->size);
      }
      lrtr_free(array->data);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      lrtr_free(array);
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

void aspa_array_free(struct aspa_array *array, bool free_provider_arrays)
{
	if (!array)
		return;

	if (array->data) {
		if (free_provider_arrays) {
			for (size_t i = 0; i < array->size; i++) {
				if (array->data[i].provider_asns) {
					lrtr_free(array->data[i].provider_asns);
					array->data[i].provider_asns = NULL;
				}
			}
		}

		lrtr_free(array->data);
	}

	lrtr_free(array);
}